

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void apx_server_start(apx_server_t *self)

{
  apx_server_t *self_local;
  
  if (self != (apx_server_t *)0x0) {
    apx_server_init_extensions(self);
    apx_connectionManager_start(&self->connection_manager);
    if ((self->is_event_thread_valid & 1U) == 0) {
      apx_server_start_thread(self);
    }
  }
  return;
}

Assistant:

void apx_server_start(apx_server_t *self)
{

   if( self != 0 )
   {
      apx_server_init_extensions(self);
#ifndef UNIT_TEST
      apx_connectionManager_start(&self->connection_manager);
      if (self->is_event_thread_valid == false)
      {
         apx_server_start_thread(self);
      }
#endif
   }
}